

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O1

int ssl_bitmask_check(uchar *mask,size_t len)

{
  ulong uVar1;
  long lVar2;
  
  if (7 < len) {
    uVar1 = 0;
    do {
      if (mask[uVar1] != 0xff) {
        return -1;
      }
      uVar1 = uVar1 + 1;
    } while (len >> 3 != uVar1);
  }
  if ((len & 7) != 0) {
    lVar2 = 0;
    do {
      if ((mask[len >> 3] >> ((int)lVar2 + 7U & 0x1f) & 1) == 0) {
        return -1;
      }
      lVar2 = lVar2 + -1;
    } while (-lVar2 != (len & 7));
  }
  return 0;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_bitmask_check(unsigned char *mask, size_t len)
{
    size_t i;

    for (i = 0; i < len / 8; i++) {
        if (mask[i] != 0xFF) {
            return -1;
        }
    }

    for (i = 0; i < len % 8; i++) {
        if ((mask[len / 8] & (1 << (7 - i))) == 0) {
            return -1;
        }
    }

    return 0;
}